

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O2

string * __thiscall
VariableStruct::OutputDef_abi_cxx11_(string *__return_storage_ptr__,VariableStruct *this)

{
  VARTYPE VarType;
  int loop;
  int iVar1;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  VarType = this->Type;
  if (this->Class == VARCLASS_CONST) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  OutputVarType_abi_cxx11_(&local_40,VarType);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->Prefix)._M_string_length != 0) {
    std::operator+(&local_40,&this->Prefix,".");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  if (this->Type == VARTYPE_FIXSTR) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->Class == VARCLASS_FUNC) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if (this->Class == VARCLASS_ARRAY) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (iVar1 = 2; iVar1 <= this->ParCount; iVar1 = iVar1 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  OutputVarInit_abi_cxx11_(&local_40,this->Class,this->Type);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  this->Output = 1;
  return __return_storage_ptr__;
}

Assistant:

std::string VariableStruct::OutputDef(void)
{
	//
	// Local Variables
	//
	std::string result;
	VARTYPE ActualType = Type;

	//
	// Output This Variable
	//
	switch (Class)
	{
	case VARCLASS_CONST:
		result = "const ";
		break;
	}

	result += OutputVarType(ActualType);
	result += " ";

	//
	// Pick a good name
	//
	if (Prefix.length() != 0)
	{
		result += Prefix + ".";
	}

	//
	// Pick a good name
	//
	if (CName.length() != 0)
	{
		result += CName;
	}
	else
	{
		result += BasicName;
	}

	switch(Type)
	{
	case VARTYPE_FIXSTR:
		result += "[]";
		break;
	}

	//
	// Add brackets if this is an array definition
	//
	switch (Class)
	{
	case VARCLASS_ARRAY:
		//
		// Default array dimension under Basic is 0..10
		// for most Basic's I've seen.
		//
		result += "[11]";
		for (int loop = 2; loop <= ParCount; loop++)
		{
			result += "[11]";
		}
		break;

	case VARCLASS_FUNC:
		result += "()";
		break;
	}

	result += OutputVarInit(Class, Type);

	//
	// Flag this one as having been output.
	//
	Output = true;
	return result;
}